

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTDeclarations::renameGlobalVar(RenameASTDeclarations *this,VarDecl *node)

{
  element_type *peVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string oldIdent;
  VarDecl *node_local;
  RenameASTDeclarations *this_local;
  
  oldIdent.field_2._8_8_ = node;
  peVar1 = std::
           __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->decl);
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar1->identifier);
  std::__cxx11::string::string((string *)local_38,(string *)&peVar2->val);
  std::operator+(&local_58,"@",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  peVar1 = std::
           __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(oldIdent.field_2._8_8_ + 0x18));
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar1->identifier);
  std::__cxx11::string::operator=((string *)&peVar2->val,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void renameGlobalVar(ast::VarDecl &node) const {
    auto oldIdent = node.decl->identifier->val;
    node.decl->identifier->val = "@" + oldIdent;
  }